

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O3

void __thiscall PEFile::_init(PEFile *this,AbstractByteBuffer *v_buf)

{
  _Rb_tree_header *p_Var1;
  map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
  *this_00;
  int iVar2;
  ResourcesAlbum *pRVar3;
  ExeElementWrapper *this_01;
  mapped_type *ppEVar4;
  FileHdrWrapper *pFVar5;
  void *pvVar6;
  RichHdrWrapper *this_02;
  OptHdrWrapper *pOVar7;
  undefined4 extraout_var;
  SectHdrsWrapper *this_03;
  PEElementWrapper *this_04;
  DataDirEntryWrapper *pDVar8;
  BoundImpDirWrapper *this_05;
  ExportDirWrapper *this_06;
  LdConfigDirWrapper *this_07;
  RelocDirWrapper *this_08;
  ExceptionDirWrapper *this_09;
  ResourceDirWrapper *this_10;
  ExeException *pEVar9;
  key_type kVar10;
  key_type local_68;
  QString local_60;
  QString local_48;
  
  PECore::wrap(&this->core,v_buf);
  pRVar3 = (ResourcesAlbum *)operator_new(0xe0);
  pRVar3->_vptr_ResourcesAlbum = (_func_int **)&PTR__ResourcesAlbum_00153198;
  (pRVar3->allTypes).super__Vector_base<pe::resource_type,_std::allocator<pe::resource_type>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pRVar3->allTypes).super__Vector_base<pe::resource_type,_std::allocator<pe::resource_type>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pRVar3->allTypes).super__Vector_base<pe::resource_type,_std::allocator<pe::resource_type>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(pRVar3->allWrappers)._M_t._M_impl.super__Rb_tree_header;
  (pRVar3->allWrappers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pRVar3->allWrappers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pRVar3->allWrappers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pRVar3->allWrappers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pRVar3->allWrappers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(pRVar3->allLeafs)._M_t._M_impl.super__Rb_tree_header;
  (pRVar3->allLeafs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pRVar3->allLeafs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pRVar3->allLeafs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pRVar3->allLeafs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pRVar3->allLeafs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(pRVar3->idToLeafType)._M_t._M_impl.super__Rb_tree_header;
  (pRVar3->idToLeafType)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pRVar3->idToLeafType)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pRVar3->idToLeafType)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pRVar3->idToLeafType)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pRVar3->idToLeafType)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(pRVar3->leafToContentWrapper)._M_t._M_impl.super__Rb_tree_header;
  (pRVar3->leafToContentWrapper)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pRVar3->leafToContentWrapper)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pRVar3->leafToContentWrapper)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pRVar3->leafToContentWrapper)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (pRVar3->leafToContentWrapper)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->album = pRVar3;
  this_01 = (ExeElementWrapper *)operator_new(0x10);
  ExeElementWrapper::ExeElementWrapper(this_01,(Executable *)this);
  (this_01->super_AbstractByteBuffer)._vptr_AbstractByteBuffer =
       (_func_int **)&PTR__AbstractByteBuffer_00157c10;
  this->dosHdrWrapper = (DosHdrWrapper *)this_01;
  this_00 = &(this->super_MappedExe).super_ExeWrappersContainer.wrappers;
  local_68 = 0;
  ppEVar4 = std::
            map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
            ::operator[](this_00,&local_68);
  *ppEVar4 = this_01;
  pFVar5 = (FileHdrWrapper *)operator_new(0x20);
  PEElementWrapper::PEElementWrapper((PEElementWrapper *)pFVar5,this);
  (pFVar5->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
  _vptr_AbstractByteBuffer = (_func_int **)&PTR__AbstractByteBuffer_00153338;
  pFVar5->hdr = (IMAGE_FILE_HEADER *)0x0;
  this->fHdr = pFVar5;
  pvVar6 = FileHdrWrapper::getPtr(pFVar5);
  if (pvVar6 == (void *)0x0) {
    pEVar9 = (ExeException *)__cxa_allocate_exception(0x48);
    QString::QString(&local_48,"Cannot parse FileHdr: It is not PE File!");
    ExeException::ExeException(pEVar9,&local_48);
    __cxa_throw(pEVar9,&ExeException::typeinfo,CustomException::~CustomException);
  }
  pFVar5 = this->fHdr;
  local_68 = 2;
  ppEVar4 = std::
            map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
            ::operator[](this_00,&local_68);
  *ppEVar4 = (mapped_type)pFVar5;
  this_02 = (RichHdrWrapper *)operator_new(0x30);
  PEElementWrapper::PEElementWrapper((PEElementWrapper *)this_02,this);
  (this_02->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
  _vptr_AbstractByteBuffer = (_func_int **)&PTR__AbstractByteBuffer_001531f8;
  this_02->richSign = (RICH_SIGNATURE *)0x0;
  this_02->dansHdr = (RICH_DANS_HEADER *)0x0;
  this_02->compIdCounter = 0;
  RichHdrWrapper::wrap(this_02);
  local_68 = 1;
  ppEVar4 = std::
            map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
            ::operator[](this_00,&local_68);
  *ppEVar4 = (mapped_type)this_02;
  pOVar7 = (OptHdrWrapper *)operator_new(0x40);
  OptHdrWrapper::OptHdrWrapper(pOVar7,this);
  this->optHdr = pOVar7;
  iVar2 = (*(pOVar7->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])(pOVar7);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    pOVar7 = this->optHdr;
    local_68 = 3;
    ppEVar4 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](this_00,&local_68);
    *ppEVar4 = (mapped_type)pOVar7;
    this_03 = (SectHdrsWrapper *)operator_new(0xb0);
    SectHdrsWrapper::SectHdrsWrapper(this_03,this);
    this->sects = this_03;
    local_68 = 5;
    ppEVar4 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](this_00,&local_68);
    *ppEVar4 = (mapped_type)this_03;
    this_04 = (PEElementWrapper *)operator_new(0x18);
    PEElementWrapper::PEElementWrapper(this_04,this);
    (this_04->super_ExeElementWrapper).super_AbstractByteBuffer._vptr_AbstractByteBuffer =
         (_func_int **)&PTR__AbstractByteBuffer_00153908;
    local_68 = 4;
    ppEVar4 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](this_00,&local_68);
    *ppEVar4 = (mapped_type)this_04;
    pDVar8 = (DataDirEntryWrapper *)operator_new(0xa8);
    ImportDirWrapper::ImportDirWrapper((ImportDirWrapper *)pDVar8,this);
    this->dataDirEntries[1] = pDVar8;
    pDVar8 = (DataDirEntryWrapper *)operator_new(0xa8);
    DelayImpDirWrapper::DelayImpDirWrapper((DelayImpDirWrapper *)pDVar8,this);
    this->dataDirEntries[0xd] = pDVar8;
    this_05 = (BoundImpDirWrapper *)operator_new(0x58);
    BoundImpDirWrapper::BoundImpDirWrapper(this_05,this);
    this->dataDirEntries[0xb] = (DataDirEntryWrapper *)this_05;
    pDVar8 = (DataDirEntryWrapper *)operator_new(0x50);
    DebugDirWrapper::DebugDirWrapper((DebugDirWrapper *)pDVar8,this);
    this->dataDirEntries[6] = pDVar8;
    this_06 = (ExportDirWrapper *)operator_new(0x80);
    ExportDirWrapper::ExportDirWrapper(this_06,this);
    this->dataDirEntries[0] = (DataDirEntryWrapper *)this_06;
    pDVar8 = (DataDirEntryWrapper *)operator_new(0x50);
    SecurityDirWrapper::SecurityDirWrapper((SecurityDirWrapper *)pDVar8,this);
    this->dataDirEntries[4] = pDVar8;
    pDVar8 = (DataDirEntryWrapper *)operator_new(0x50);
    TlsDirWrapper::TlsDirWrapper((TlsDirWrapper *)pDVar8,this);
    this->dataDirEntries[9] = pDVar8;
    this_07 = (LdConfigDirWrapper *)operator_new(0x80);
    LdConfigDirWrapper::LdConfigDirWrapper(this_07,this);
    this->dataDirEntries[10] = (DataDirEntryWrapper *)this_07;
    this_08 = (RelocDirWrapper *)operator_new(0x58);
    RelocDirWrapper::RelocDirWrapper(this_08,this);
    this->dataDirEntries[5] = (DataDirEntryWrapper *)this_08;
    this_09 = (ExceptionDirWrapper *)operator_new(0x58);
    ExceptionDirWrapper::ExceptionDirWrapper(this_09,this);
    this->dataDirEntries[3] = (DataDirEntryWrapper *)this_09;
    this_10 = (ResourceDirWrapper *)operator_new(0x70);
    ResourceDirWrapper::ResourceDirWrapper(this_10,this,this->album,0,0,-1);
    this->dataDirEntries[2] = (DataDirEntryWrapper *)this_10;
    pDVar8 = (DataDirEntryWrapper *)operator_new(0x50);
    ClrDirWrapper::ClrDirWrapper((ClrDirWrapper *)pDVar8,this);
    this->dataDirEntries[0xe] = pDVar8;
    kVar10 = 6;
    do {
      pDVar8 = this->dataDirEntries[kVar10 - 6];
      local_68 = kVar10;
      ppEVar4 = std::
                map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
                ::operator[](this_00,&local_68);
      *ppEVar4 = (mapped_type)pDVar8;
      kVar10 = kVar10 + 1;
    } while (kVar10 != 0x15);
    if (this->album != (ResourcesAlbum *)0x0) {
      ResourcesAlbum::wrapLeafsContent(this->album);
    }
    return;
  }
  pEVar9 = (ExeException *)__cxa_allocate_exception(0x48);
  QString::QString(&local_60,"Cannot parse OptionalHeader: It is not PE File!");
  ExeException::ExeException(pEVar9,&local_60);
  __cxa_throw(pEVar9,&ExeException::typeinfo,CustomException::~CustomException);
}

Assistant:

void PEFile::_init(AbstractByteBuffer *v_buf)
{
    // wrap the core:
    core.wrap(v_buf);

    album = new ResourcesAlbum(this);
    
    //generate wrappers:
    this->dosHdrWrapper = new DosHdrWrapper(this);
    this->wrappers[WR_DOS_HDR] = this->dosHdrWrapper;

    this->fHdr = new FileHdrWrapper(this);
    if (fHdr->getPtr() == NULL) throw ExeException("Cannot parse FileHdr: It is not PE File!");
    this->wrappers[WR_FILE_HDR] = fHdr;
    this->wrappers[WR_RICH_HDR] = new RichHdrWrapper(this);

    this->optHdr = new OptHdrWrapper(this);
    if (optHdr->getPtr() == NULL) throw ExeException("Cannot parse OptionalHeader: It is not PE File!");
    this->wrappers[WR_OPTIONAL_HDR] = optHdr;

    this->sects = new SectHdrsWrapper(this);
    this->wrappers[WR_SECTIONS] = sects;

    this->wrappers[WR_DATADIR] = new DataDirWrapper(this);
    dataDirEntries[pe::DIR_IMPORT] = new ImportDirWrapper(this);
    dataDirEntries[pe::DIR_DELAY_IMPORT] = new DelayImpDirWrapper(this);
    dataDirEntries[pe::DIR_BOUND_IMPORT] = new BoundImpDirWrapper(this);
    dataDirEntries[pe::DIR_DEBUG] = new DebugDirWrapper(this);
    dataDirEntries[pe::DIR_EXPORT] = new ExportDirWrapper(this);
    dataDirEntries[pe::DIR_SECURITY] = new SecurityDirWrapper(this);
    dataDirEntries[pe::DIR_TLS] = new TlsDirWrapper(this);
    dataDirEntries[pe::DIR_LOAD_CONFIG] = new LdConfigDirWrapper(this);
    dataDirEntries[pe::DIR_BASERELOC] = new RelocDirWrapper(this);
    dataDirEntries[pe::DIR_EXCEPTION] = new ExceptionDirWrapper(this);
    dataDirEntries[pe::DIR_RESOURCE] = new ResourceDirWrapper(this, album);
    dataDirEntries[pe::DIR_COM_DESCRIPTOR] = new ClrDirWrapper(this); 
 
    for (int i = 0; i < pe::DIR_ENTRIES_COUNT; i++) {
        this->wrappers[WR_DIR_ENTRY + i] = dataDirEntries[i];
    }
    if (this->album) {
        this->album->wrapLeafsContent();
    }
}